

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osdtext.cpp
# Opt level: O2

int __thiscall
CGL::OSDText::add_line(OSDText *this,float x,float y,string *text,size_t size,Color color)

{
  undefined4 uVar1;
  undefined1 local_68 [16];
  _Alloc_hider local_58;
  size_type sStack_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  size_t local_38;
  undefined1 auStack_30 [16];
  
  sStack_50 = 0;
  local_48._8_8_ = 0;
  auStack_30._8_8_ = 0;
  local_38 = 0;
  local_58._M_p = (pointer)&local_48;
  local_48._M_allocated_capacity = 0;
  auStack_30._0_4_ = 0.0;
  auStack_30._4_4_ = 0.0;
  local_68._0_4_ = 0;
  local_68._12_4_ = 0;
  local_68._8_4_ = y;
  local_68._4_4_ = x;
  std::__cxx11::string::_M_assign((string *)&local_58);
  auStack_30._8_4_ = color.b;
  local_38 = size;
  if (this->use_hdpi == true) {
    local_38 = size * 2;
  }
  local_68._0_4_ = this->next_id;
  this->next_id = this->next_id + 1;
  auStack_30._0_8_ = color._0_8_;
  std::vector<CGL::OSDLine,_std::allocator<CGL::OSDLine>_>::push_back
            (&this->lines,(value_type *)local_68);
  uVar1 = local_68._0_4_;
  std::__cxx11::string::~string((string *)&local_58);
  return uVar1;
}

Assistant:

int OSDText::add_line(float x, float y, string text,
                      size_t size, Color color) {
  // create new line
  OSDLine new_line = OSDLine();
  new_line.x = x;
  new_line.y = y;
  new_line.text = text;
  new_line.size = size;
  new_line.color = color;

  // handle HDPI display
  if (use_hdpi) new_line.size *= 2;

  // update id
  new_line.id = next_id;
  next_id++;

  // add line
  lines.push_back(new_line);

  return new_line.id;
}